

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGFreeStates(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGStatesPtr states)

{
  int iVar1;
  xmlRelaxNGStatesPtr *ppxVar2;
  
  if (states != (xmlRelaxNGStatesPtr)0x0) {
    if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
LAB_0017a16a:
      (*xmlFree)(states->tabState);
      (*xmlFree)(states);
      return;
    }
    ppxVar2 = ctxt->freeStates;
    if (ppxVar2 == (xmlRelaxNGStatesPtr *)0x0) {
      ctxt->freeStatesNr = 0;
      ctxt->freeStatesMax = 0x28;
      ppxVar2 = (xmlRelaxNGStatesPtr *)(*xmlMalloc)(0x140);
      ctxt->freeStates = ppxVar2;
      if (ppxVar2 == (xmlRelaxNGStatesPtr *)0x0) {
        xmlRngVErrMemory(ctxt);
        ppxVar2 = ctxt->freeStates;
        if (ppxVar2 == (xmlRelaxNGStatesPtr *)0x0) goto LAB_0017a16a;
      }
    }
    else if (ctxt->freeStatesMax <= ctxt->freeStatesNr) {
      ppxVar2 = (xmlRelaxNGStatesPtr *)(*xmlRealloc)(ppxVar2,(long)ctxt->freeStatesMax << 4);
      if (ppxVar2 == (xmlRelaxNGStatesPtr *)0x0) {
        xmlRngVErrMemory(ctxt);
        goto LAB_0017a16a;
      }
      ctxt->freeStates = ppxVar2;
      ctxt->freeStatesMax = ctxt->freeStatesMax << 1;
    }
    iVar1 = ctxt->freeStatesNr;
    ctxt->freeStatesNr = iVar1 + 1;
    ppxVar2[iVar1] = states;
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeStates(xmlRelaxNGValidCtxtPtr ctxt,
                     xmlRelaxNGStatesPtr states)
{
    if (states == NULL)
        return;
    if ((ctxt != NULL) && (ctxt->freeStates == NULL)) {
        ctxt->freeStatesMax = 40;
        ctxt->freeStatesNr = 0;
        ctxt->freeStates = (xmlRelaxNGStatesPtr *)
            xmlMalloc(ctxt->freeStatesMax * sizeof(xmlRelaxNGStatesPtr));
        if (ctxt->freeStates == NULL) {
            xmlRngVErrMemory(ctxt);
        }
    } else if ((ctxt != NULL)
               && (ctxt->freeStatesNr >= ctxt->freeStatesMax)) {
        xmlRelaxNGStatesPtr *tmp;

        tmp = (xmlRelaxNGStatesPtr *) xmlRealloc(ctxt->freeStates,
                                                 2 * ctxt->freeStatesMax *
                                                 sizeof
                                                 (xmlRelaxNGStatesPtr));
        if (tmp == NULL) {
            xmlRngVErrMemory(ctxt);
            xmlFree(states->tabState);
            xmlFree(states);
            return;
        }
        ctxt->freeStates = tmp;
        ctxt->freeStatesMax *= 2;
    }
    if ((ctxt == NULL) || (ctxt->freeStates == NULL)) {
        xmlFree(states->tabState);
        xmlFree(states);
    } else {
        ctxt->freeStates[ctxt->freeStatesNr++] = states;
    }
}